

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O2

unique_ptr<jsoncons::jsonschema::contains_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::contains_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_contains_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *parent,
          anchor_uri_map_type *anchor_dict)

{
  type_conflict2 tVar1;
  undefined8 uVar2;
  const_object_iterator cVar3;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  keys;
  allocator<char> local_1e9;
  type_conflict2 value_1;
  type_conflict2 value;
  string local_1d8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [48];
  uri path;
  string sub_keys [1];
  uri schema_location;
  
  local_1a8._40_8_ = parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,"contains",(allocator<char> *)sub_keys);
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::make_schema_location
            (&schema_location,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)sch,&path.uri_string_);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)sub_keys,"contains",(allocator<char> *)&path);
  local_1b8._8_8_ = 0;
  path.uri_string_._M_dataplus._M_p = &DAT_0000000b;
  path.uri_string_._M_string_length = (size_type)anon_var_dwarf_1ea38b8;
  cVar3 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::find_abi_cxx11_
                    ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     anchor_dict,(string_view_type *)&path);
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
            ((const_object_range_type *)&path,
             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)anchor_dict)
  ;
  if ((((undefined1  [16])cVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     ((path.uri_string_.field_2._M_local_buf[8] & 1U) == 0)) {
    if (cVar3.has_value_ == (bool)path.uri_string_.field_2._M_local_buf[8]) goto LAB_0039303c;
LAB_00392f6b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"maxContains",(allocator<char> *)local_1a8);
    compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::make_schema_location
              (&path,(compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)sch,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    value = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
            as_integer<unsigned_long>(&(cVar3.it_._M_current._M_current)->value_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"maxContains",(allocator<char> *)local_1b8);
    compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::get_custom_message
              (&local_1d8,
               (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)sch,(string *)local_1a8);
    std::
    make_unique<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,unsigned_long&>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &value_1,(uri *)anchor_dict,&path.uri_string_,(unsigned_long *)&local_1d8);
    uVar2 = local_1b8._8_8_;
    local_1b8._8_8_ = value_1;
    value_1 = 0;
    if ((pointer)uVar2 != (pointer)0x0) {
      (**(code **)(((heap_string_base<unsigned_long,_std::allocator<char>_> *)uVar2)->extra_ + 8))()
      ;
      if (value_1 != 0) {
        (**(code **)(*(long *)value_1 + 8))();
      }
    }
    value_1 = 0;
  }
  else {
    if (cVar3.it_._M_current._M_current !=
        (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
         *)path.uri_string_.field_2._M_allocated_capacity) goto LAB_00392f6b;
LAB_0039303c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"maxContains",(allocator<char> *)local_1a8);
    compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::make_schema_location
              (&path,(compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)sch,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"maxContains",(allocator<char> *)local_1b8);
    compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::get_custom_message
              (&local_1d8,
               (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)sch,(string *)local_1a8);
    value_1 = 0xffffffffffffffff;
    std::
    make_unique<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,unsigned_long>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)&value,
               (uri *)anchor_dict,&path.uri_string_,(unsigned_long *)&local_1d8);
    local_1b8._8_8_ = value;
    value = 0;
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&path);
  value = 0;
  path.uri_string_._M_dataplus._M_p = &DAT_0000000b;
  path.uri_string_._M_string_length = (size_type)anon_var_dwarf_1ea38c5;
  cVar3 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::find_abi_cxx11_
                    ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     anchor_dict,(string_view_type *)&path);
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
            ((const_object_range_type *)&path,
             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)anchor_dict)
  ;
  if ((((undefined1  [16])cVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     ((path.uri_string_.field_2._M_local_buf[8] & 1U) == 0)) {
    if (cVar3.has_value_ == (bool)path.uri_string_.field_2._M_local_buf[8]) goto LAB_00393223;
  }
  else if (cVar3.it_._M_current._M_current ==
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)path.uri_string_.field_2._M_allocated_capacity) {
LAB_00393223:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"minContains",(allocator<char> *)local_1a8);
    compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::make_schema_location
              (&path,(compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)sch,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,"minContains",&local_1e9)
    ;
    compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::get_custom_message
              (&local_1d8,
               (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)sch,(string *)local_1a8);
    local_1b8._0_4_ = 1;
    std::
    make_unique<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,int>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &value_1,(uri *)anchor_dict,&path.uri_string_,(int *)&local_1d8);
    value = value_1;
    value_1 = 0;
    goto LAB_003932b6;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"minContains",(allocator<char> *)local_1a8);
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::make_schema_location
            (&path,(compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)sch,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  value_1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
            as_integer<unsigned_long>(&(cVar3.it_._M_current._M_current)->value_);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,"minContains",&local_1e9);
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::get_custom_message
            (&local_1d8,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)sch,(string *)local_1a8);
  std::
  make_unique<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,unsigned_long&>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)local_1b8
             ,(uri *)anchor_dict,&path.uri_string_,(unsigned_long *)&local_1d8);
  uVar2 = local_1b8._0_8_;
  tVar1 = value;
  local_1b8._0_8_ = (long *)0x0;
  value = uVar2;
  if (tVar1 != 0) {
    (**(code **)(*(long *)tVar1 + 8))();
    if ((long *)local_1b8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._0_8_ + 8))();
    }
  }
  local_1b8._0_8_ = 0;
LAB_003932b6:
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"contains",(allocator<char> *)&value_1);
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::get_custom_message
            (&path.uri_string_,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)sch,&local_1d8);
  keys.size_ = (size_type)sub_keys;
  keys.data_ = (pointer)local_1a8._40_8_;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::make_cross_draft_schema_validator
            ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)local_1a8,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)(context->base_uri_).uri_.uri_string_._M_dataplus._M_p,sch,keys,
             (anchor_uri_map_type *)0x1);
  std::
  make_unique<jsoncons::jsonschema::contains_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::unique_ptr<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::unique_ptr<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             (uri *)anchor_dict,&schema_location.uri_string_,
             (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              *)&path,(unique_ptr<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                       *)local_1a8,
             (unique_ptr<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              *)(local_1b8 + 8));
  if ((long *)local_1a8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1a8._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (value != 0) {
    (**(code **)(*(long *)value + 8))();
  }
  if ((pointer)local_1b8._8_8_ != (pointer)0x0) {
    (**(code **)(((heap_string_base<unsigned_long,_std::allocator<char>_> *)local_1b8._8_8_)->extra_
                + 8))();
  }
  std::__cxx11::string::~string((string *)sub_keys);
  std::__cxx11::string::~string((string *)&schema_location);
  return (__uniq_ptr_data<jsoncons::jsonschema::contains_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::contains_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::contains_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::contains_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<contains_validator<Json>> make_contains_validator(const compilation_context<Json>& context,
            const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict)
        {
            uri schema_location = context.make_schema_location("contains");

            std::string sub_keys[] = { "contains" };

            std::unique_ptr<max_contains_keyword<Json>> max_contains;
            auto it = parent.find("maxContains");
            if (it != parent.object_range().end()) 
            {
                uri path = context.make_schema_location("maxContains");
                auto value = (*it).value().template as<std::size_t>();
                max_contains = jsoncons::make_unique<max_contains_keyword<Json>>(parent, path, context.get_custom_message("maxContains"), value);
            }
            else
            {
                uri path = context.make_schema_location("maxContains");
                max_contains = jsoncons::make_unique<max_contains_keyword<Json>>(parent, path, context.get_custom_message("maxContains"), (std::numeric_limits<std::size_t>::max)());
            }

            std::unique_ptr<min_contains_keyword<Json>> min_contains;
            it = parent.find("minContains");
            if (it != parent.object_range().end()) 
            {
                uri path = context.make_schema_location("minContains");
                auto value = (*it).value().template as<std::size_t>();
                min_contains = jsoncons::make_unique<min_contains_keyword<Json>>(parent, path, context.get_custom_message("minContains"), value);
            }
            else
            {
                uri path = context.make_schema_location("minContains");
                min_contains = jsoncons::make_unique<min_contains_keyword<Json>>(parent, path, context.get_custom_message("minContains"), 1);
            }

            return jsoncons::make_unique<contains_validator<Json>>(parent, schema_location, context.get_custom_message("contains"), 
                factory_->make_cross_draft_schema_validator(context, sch, sub_keys, anchor_dict), std::move(max_contains), std::move(min_contains));
        }